

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall BasicBlock::DumpHeader(BasicBlock *this,bool insertCR)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar1;
  uint uVar2;
  uint32 uVar3;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  Loop *pLVar5;
  code *pcVar6;
  bool bVar7;
  ImplicitCallFlags flags;
  undefined4 *puVar8;
  Type *ppFVar9;
  BasicBlock *pBVar10;
  char16 *form;
  undefined7 in_register_00000031;
  char16_t *pcVar11;
  bool bVar12;
  undefined1 local_40 [8];
  Iterator __iter;
  
  if ((int)CONCAT71(in_register_00000031,insertCR) != 0) {
    Output::Print(L"\n");
  }
  Output::Print(L"BLOCK %d:",(ulong)this->number);
  if ((this->field_0x18 & 2) != 0) {
    Output::Print(L" **** DEAD ****");
  }
  uVar2 = *(uint *)&this->field_0x18;
  if ((uVar2 >> 8 & 1) == 0) {
    if ((uVar2 >> 9 & 1) != 0) {
      pcVar11 = L" **** Air lock Block ****";
      goto LAB_00417658;
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      pcVar11 = L" **** Break Source Compensation Code ****";
      goto LAB_00417658;
    }
    if ((uVar2 >> 10 & 1) != 0) {
      pcVar11 = L" **** Break Sink Compensation Code ****";
      goto LAB_00417658;
    }
    if ((uVar2 & 0x40) != 0) {
      pcVar11 = L" **** Airlock block Compensation Code ****";
      goto LAB_00417658;
    }
  }
  else {
    pcVar11 = L" **** Break Block ****";
LAB_00417658:
    Output::Print(pcVar11);
  }
  pSVar1 = &this->predList;
  if ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
      (this->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar1) {
    bVar12 = false;
    Output::Print(L" In(");
    local_40 = (undefined1  [8])pSVar1;
    __iter.list = &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) goto LAB_00417c7d;
        *puVar8 = 0;
      }
      pSVar4 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
               ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar4 == local_40) break;
      __iter.list = pSVar4;
      ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_40);
      pBVar10 = (*ppFVar9)->predBlock;
      if (pBVar10 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xfe1,"(blockPred)","blockPred");
        if (!bVar7) goto LAB_00417c7d;
        *puVar8 = 0;
      }
      if (bVar12) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pBVar10->number);
      bVar12 = true;
    }
    Output::Print(L")");
  }
  pSVar1 = &this->succList;
  if ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
      (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar1) {
    bVar12 = false;
    Output::Print(L" Out(");
    local_40 = (undefined1  [8])pSVar1;
    __iter.list = &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) goto LAB_00417c7d;
        *puVar8 = 0;
      }
      pSVar4 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
               ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar4 == local_40) break;
      __iter.list = pSVar4;
      ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_40);
      pBVar10 = (*ppFVar9)->succBlock;
      if (pBVar10 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xff3,"(blockSucc)","blockSucc");
        if (!bVar7) goto LAB_00417c7d;
        *puVar8 = 0;
      }
      if (bVar12) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pBVar10->number);
      bVar12 = true;
    }
    Output::Print(L")");
  }
  pSVar1 = &this->deadPredList;
  if ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
      (this->deadPredList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar1) {
    bVar12 = false;
    Output::Print(L" DeadIn(");
    local_40 = (undefined1  [8])pSVar1;
    __iter.list = &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) goto LAB_00417c7d;
        *puVar8 = 0;
      }
      pSVar4 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
               ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar4 == local_40) break;
      __iter.list = pSVar4;
      ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_40);
      pBVar10 = (*ppFVar9)->predBlock;
      if (pBVar10 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x1004,"(blockPred)","blockPred");
        if (!bVar7) goto LAB_00417c7d;
        *puVar8 = 0;
      }
      if (bVar12) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pBVar10->number);
      bVar12 = true;
    }
    Output::Print(L")");
  }
  pSVar1 = &this->deadSuccList;
  if ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
      (this->deadSuccList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar1) {
    bVar12 = false;
    Output::Print(L" DeadOut(");
    local_40 = (undefined1  [8])pSVar1;
    __iter.list = &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar7) {
LAB_00417c7d:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar8 = 0;
      }
      pSVar4 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
               ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar4 == local_40) goto LAB_00417b7b;
      __iter.list = pSVar4;
      ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_40);
      pBVar10 = (*ppFVar9)->succBlock;
      if (pBVar10 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x1015,"(blockSucc)","blockSucc");
        if (!bVar7) goto LAB_00417c7d;
        *puVar8 = 0;
      }
      if (bVar12) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pBVar10->number);
      bVar12 = true;
    } while( true );
  }
LAB_00417b8d:
  pLVar5 = this->loop;
  if (pLVar5 != (Loop *)0x0) {
    uVar3 = pLVar5->loopNumber;
    pBVar10 = Loop::GetHeadBlock(pLVar5);
    Output::Print(L"   Loop(%d) header: %d",(ulong)(uVar3 - 1),(ulong)pBVar10->number);
    pLVar5 = this->loop->parent;
    if (pLVar5 != (Loop *)0x0) {
      uVar2 = pLVar5->loopNumber;
      pBVar10 = Loop::GetHeadBlock(pLVar5);
      Output::Print(L" parent(%d): %d",(ulong)uVar2,(ulong)pBVar10->number);
    }
    pBVar10 = Loop::GetHeadBlock(this->loop);
    if (pBVar10 == this) {
      Output::SkipToColumn(0x32);
      Output::Print(L"Call Exp/Imp: ");
      pcVar11 = L"yes/";
      if ((*(ushort *)&this->loop->field_0x178 & 8) == 0) {
        pcVar11 = L" no/";
      }
      Output::Print(pcVar11);
      flags = Loop::GetImplicitCallFlags(this->loop);
      form = Js::DynamicProfileInfo::GetImplicitCallFlagsString(flags);
      Output::Print(form);
    }
  }
  Output::Print(L"\n");
  if (insertCR) {
    Output::Print(L"\n");
  }
  return;
LAB_00417b7b:
  Output::Print(L")");
  goto LAB_00417b8d;
}

Assistant:

void
BasicBlock::DumpHeader(bool insertCR)
{
    if (insertCR)
    {
        Output::Print(_u("\n"));
    }
    Output::Print(_u("BLOCK %d:"), this->number);

    if (this->isDead)
    {
        Output::Print(_u(" **** DEAD ****"));
    }

    if (this->isBreakBlock)
    {
        Output::Print(_u(" **** Break Block ****"));
    }
    else if (this->isAirLockBlock)
    {
        Output::Print(_u(" **** Air lock Block ****"));
    }
    else if (this->isBreakCompensationBlockAtSource)
    {
        Output::Print(_u(" **** Break Source Compensation Code ****"));
    }
    else if (this->isBreakCompensationBlockAtSink)
    {
        Output::Print(_u(" **** Break Sink Compensation Code ****"));
    }
    else if (this->isAirLockCompensationBlock)
    {
        Output::Print(_u(" **** Airlock block Compensation Code ****"));
    }

    if (!this->predList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" In("));
        FOREACH_PREDECESSOR_BLOCK(blockPred, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockPred->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_PREDECESSOR_BLOCK;
        Output::Print(_u(")"));
    }


    if (!this->succList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" Out("));
        FOREACH_SUCCESSOR_BLOCK(blockSucc, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockSucc->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_SUCCESSOR_BLOCK;
        Output::Print(_u(")"));
    }

    if (!this->deadPredList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" DeadIn("));
        FOREACH_DEAD_PREDECESSOR_BLOCK(blockPred, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockPred->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_DEAD_PREDECESSOR_BLOCK;
        Output::Print(_u(")"));
    }

    if (!this->deadSuccList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" DeadOut("));
        FOREACH_DEAD_SUCCESSOR_BLOCK(blockSucc, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockSucc->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_DEAD_SUCCESSOR_BLOCK;
        Output::Print(_u(")"));
    }

    if (this->loop)
    {
        Output::Print(_u("   Loop(%d) header: %d"), this->loop->loopNumber - 1, this->loop->GetHeadBlock()->GetBlockNum());

        if (this->loop->parent)
        {
            Output::Print(_u(" parent(%d): %d"), this->loop->parent->loopNumber, this->loop->parent->GetHeadBlock()->GetBlockNum());
        }

        if (this->loop->GetHeadBlock() == this)
        {
            Output::SkipToColumn(50);
            Output::Print(_u("Call Exp/Imp: "));
            if (this->loop->GetHasCall())
            {
                Output::Print(_u("yes/"));
            }
            else
            {
                Output::Print(_u(" no/"));
            }
            Output::Print(Js::DynamicProfileInfo::GetImplicitCallFlagsString(this->loop->GetImplicitCallFlags()));
        }
    }

    Output::Print(_u("\n"));
    if (insertCR)
    {
        Output::Print(_u("\n"));
    }
}